

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O2

vec<3UL,_double> * __thiscall vec<3UL,_double>::normalize(vec<3UL,_double> *this)

{
  double local_30;
  vec<3UL,_double> local_28;
  
  local_30 = norm(this);
  operator/(&local_28,this,&local_30);
  this->z = local_28.z;
  this->x = local_28.x;
  this->y = local_28.y;
  return this;
}

Assistant:

vec& normalize()
    {
        *this = (*this) / norm();
        return *this;
    }